

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT *nodes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  REF_INT new_cell;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)ref_cell->node_per;
  if (ref_cell->node_per < 1) {
    uVar4 = uVar5;
  }
  bVar6 = false;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    bVar1 = !bVar6;
    bVar6 = true;
    if (bVar1) {
      bVar6 = ref_subdiv->grid->mpi->id == ref_subdiv->grid->node->part[nodes[uVar5]];
    }
  }
  uVar3 = 0;
  if (bVar6) {
    uVar2 = ref_cell_add(ref_cell,nodes,&new_cell);
    uVar3 = 0;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x402,"ref_subdiv_add_local_cell",(ulong)uVar2,"add");
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,
                                                    REF_CELL ref_cell,
                                                    REF_INT *nodes) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}